

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O3

bool tinyusdz::BuildSkelTopology
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<int,_std::allocator<int>_> *dst,string *err)

{
  pointer pTVar1;
  undefined8 uVar2;
  bool bVar3;
  mapped_type_conflict2 *pmVar4;
  const_iterator cVar5;
  pointer pPVar6;
  pointer pTVar7;
  pointer pPVar8;
  string *p_00;
  pointer pTVar9;
  Path *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  mapped_type_conflict2 mVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  int iVar13;
  long lVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  pathMap;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  Path p;
  string _err;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Base_ptr local_230;
  size_t local_228;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_220;
  vector<int,_std::allocator<int>_> *local_208;
  Path local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  long *local_120 [2];
  long local_110 [2];
  Path local_100;
  
  pTVar1 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar7 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar7) {
    bVar3 = true;
  }
  else {
    local_260._8_8_ = err;
    local_208 = dst;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              (&local_220,(long)pTVar7 - (long)pTVar1 >> 5,(allocator_type *)&local_200);
    local_260._0_8_ = (pointer)0x0;
    pTVar1 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pTVar7 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    pTVar9 = pTVar7;
    if (pTVar7 != pTVar1) {
      pTVar7 = pTVar1;
      do {
        paVar12 = &local_100._prim_part.field_2;
        p_00 = &pTVar7[local_260._0_8_].str_;
        local_100._prim_part._M_dataplus._M_p = (pointer)paVar12;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
        Path::Path(&local_200,p_00,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != paVar12) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_100._prim_part.field_2._M_local_buf[0]) + 1);
        }
        uVar2 = local_260._8_8_;
        if (local_200._valid == false) {
          if ((string *)local_260._8_8_ != (string *)0x0) {
            local_250._0_8_ = &local_240;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_250,"joints[{}] is invalid Prim path: `{}`","");
            fmt::format<unsigned_long,std::__cxx11::string>
                      ((string *)&local_100,(fmt *)local_250,(string *)local_260,
                       (unsigned_long *)
                       ((joints->
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_260._0_8_),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
LAB_005c5273:
            ::std::__cxx11::string::_M_append
                      ((char *)uVar2,(ulong)local_100._prim_part._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._prim_part._M_dataplus._M_p != paVar12) {
              operator_delete(local_100._prim_part._M_dataplus._M_p,
                              CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                       local_100._prim_part.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._0_8_ != &local_240) {
              operator_delete((void *)local_250._0_8_,(ulong)(local_240._M_allocated_capacity + 1));
            }
          }
LAB_005c52ac:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._element._M_dataplus._M_p != &local_200._element.field_2) {
            operator_delete(local_200._element._M_dataplus._M_p,
                            local_200._element.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._variant_part_str._M_dataplus._M_p !=
              &local_200._variant_part_str.field_2) {
            operator_delete(local_200._variant_part_str._M_dataplus._M_p,
                            local_200._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._variant_selection_part._M_dataplus._M_p !=
              &local_200._variant_selection_part.field_2) {
            operator_delete(local_200._variant_selection_part._M_dataplus._M_p,
                            local_200._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._variant_part._M_dataplus._M_p != &local_200._variant_part.field_2) {
            operator_delete(local_200._variant_part._M_dataplus._M_p,
                            local_200._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._prop_part._M_dataplus._M_p != &local_200._prop_part.field_2) {
            operator_delete(local_200._prop_part._M_dataplus._M_p,
                            local_200._prop_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._prim_part._M_dataplus._M_p != &local_200._prim_part.field_2) {
            operator_delete(local_200._prim_part._M_dataplus._M_p,
                            local_200._prim_part.field_2._M_allocated_capacity + 1);
          }
LAB_005c5381:
          bVar3 = false;
          goto LAB_005c5383;
        }
        if ((local_200._prim_part._M_string_length == 1) &&
           (*local_200._prim_part._M_dataplus._M_p == '/')) {
          if ((string *)local_260._8_8_ != (string *)0x0) {
            local_250._0_8_ = &local_240;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_250,
                       "joints[{}] Root Prim path \'/\' cannot be used for joint Prim path.","");
            fmt::format<unsigned_long>
                      ((string *)&local_100,(string *)local_250,(unsigned_long *)local_260);
            goto LAB_005c5273;
          }
          goto LAB_005c52ac;
        }
        local_100._prim_part._M_string_length = 0;
        local_100._prim_part.field_2._M_local_buf[0] = '\0';
        local_100._prim_part._M_dataplus._M_p = (pointer)paVar12;
        bVar3 = pathutil::ValidatePrimPath(&local_200,(string *)&local_100);
        if (bVar3) {
          Path::operator=(local_220.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_260._0_8_,&local_200);
        }
        else if ((string *)local_260._8_8_ != (string *)0x0) {
          local_120[0] = local_110;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"joints[{}] is not a valid Prim path: `{}`, reason = {}",""
                    );
          in_R8 = &local_100;
          fmt::format<unsigned_long,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_250,(fmt *)local_120,(string *)local_260,
                     (unsigned_long *)
                     ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_260._0_8_),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                     ,in_R9);
          ::std::__cxx11::string::_M_append((char *)local_260._8_8_,local_250._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._0_8_ != &local_240) {
            operator_delete((void *)local_250._0_8_,(ulong)(local_240._M_allocated_capacity + 1));
          }
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_100._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._element._M_dataplus._M_p != &local_200._element.field_2) {
          operator_delete(local_200._element._M_dataplus._M_p,
                          local_200._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._variant_part_str._M_dataplus._M_p != &local_200._variant_part_str.field_2)
        {
          operator_delete(local_200._variant_part_str._M_dataplus._M_p,
                          local_200._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._variant_selection_part._M_dataplus._M_p !=
            &local_200._variant_selection_part.field_2) {
          operator_delete(local_200._variant_selection_part._M_dataplus._M_p,
                          local_200._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._variant_part._M_dataplus._M_p != &local_200._variant_part.field_2) {
          operator_delete(local_200._variant_part._M_dataplus._M_p,
                          local_200._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._prop_part._M_dataplus._M_p != &local_200._prop_part.field_2) {
          operator_delete(local_200._prop_part._M_dataplus._M_p,
                          local_200._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._prim_part._M_dataplus._M_p != &local_200._prim_part.field_2) {
          operator_delete(local_200._prim_part._M_dataplus._M_p,
                          local_200._prim_part.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_005c5381;
        local_260._0_8_ = local_260._0_8_ + 1;
        pTVar7 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar9 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      } while ((ulong)local_260._0_8_ < (pointer)((long)pTVar9 - (long)pTVar7 >> 5));
    }
    local_240._8_8_ = local_250 + 8;
    local_250._8_4_ = 0;
    local_240._M_allocated_capacity = 0;
    local_228 = 0;
    local_230 = (_Base_ptr)local_240._8_8_;
    if (local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar14 = 0;
      uVar11 = 0;
      do {
        pmVar4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_250,
                              (key_type *)
                              ((long)&((local_220.
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_prim_part).
                                      _M_dataplus._M_p + lVar14));
        *pmVar4 = (mapped_type_conflict2)uVar11;
        uVar11 = uVar11 + 1;
        lVar14 = lVar14 + 0xd0;
      } while (uVar11 < (ulong)(((long)local_220.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_220.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               0x4ec4ec4ec4ec4ec5));
      pTVar7 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar9 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
    ::std::vector<int,_std::allocator<int>_>::resize(local_208,(long)pTVar9 - (long)pTVar7 >> 5);
    if (local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_260._8_8_ = &local_100._element.field_2;
      local_128 = &local_200._element.field_2;
      local_130 = &local_200._variant_part_str.field_2;
      uVar11 = 0;
      pPVar6 = local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
               .super__Vector_impl_data._M_start;
      pPVar8 = local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
               .super__Vector_impl_data._M_finish;
      do {
        if (((pPVar6[uVar11]._valid != true) || (pPVar6[uVar11]._prim_part._M_string_length != 1))
           || (mVar10 = -1, *pPVar6[uVar11]._prim_part._M_dataplus._M_p != '/')) {
          Path::get_parent_prim_path(&local_200,pPVar6 + uVar11);
          iVar13 = 0x20000;
          do {
            mVar10 = -1;
            if ((local_200._valid != true) ||
               ((local_200._prim_part._M_string_length == 1 &&
                (*local_200._prim_part._M_dataplus._M_p == '/')))) break;
            cVar5 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_250,(key_type *)&local_200);
            if (cVar5._M_node != (_Base_ptr)(local_250 + 8)) {
              pmVar4 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_250,(key_type *)&local_200);
              mVar10 = *pmVar4;
              break;
            }
            Path::get_parent_prim_path(&local_100,&local_200);
            Path::operator=(&local_200,&local_100);
            if (local_100._element._M_dataplus._M_p != (pointer)local_260._8_8_) {
              operator_delete(local_100._element._M_dataplus._M_p,
                              local_100._element.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._variant_part_str._M_dataplus._M_p !=
                &local_100._variant_part_str.field_2) {
              operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                              local_100._variant_part_str.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._variant_selection_part._M_dataplus._M_p !=
                &local_100._variant_selection_part.field_2) {
              operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                              local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
              operator_delete(local_100._variant_part._M_dataplus._M_p,
                              local_100._variant_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
              operator_delete(local_100._prop_part._M_dataplus._M_p,
                              local_100._prop_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
              operator_delete(local_100._prim_part._M_dataplus._M_p,
                              CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                       local_100._prim_part.field_2._M_local_buf[0]) + 1);
            }
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._element._M_dataplus._M_p != local_128) {
            operator_delete(local_200._element._M_dataplus._M_p,
                            local_200._element.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._variant_part_str._M_dataplus._M_p != local_130) {
            operator_delete(local_200._variant_part_str._M_dataplus._M_p,
                            local_200._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._variant_selection_part._M_dataplus._M_p !=
              &local_200._variant_selection_part.field_2) {
            operator_delete(local_200._variant_selection_part._M_dataplus._M_p,
                            local_200._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._variant_part._M_dataplus._M_p != &local_200._variant_part.field_2) {
            operator_delete(local_200._variant_part._M_dataplus._M_p,
                            local_200._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._prop_part._M_dataplus._M_p != &local_200._prop_part.field_2) {
            operator_delete(local_200._prop_part._M_dataplus._M_p,
                            local_200._prop_part.field_2._M_allocated_capacity + 1);
          }
          pPVar6 = local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pPVar8 = local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._prim_part._M_dataplus._M_p != &local_200._prim_part.field_2) {
            operator_delete(local_200._prim_part._M_dataplus._M_p,
                            local_200._prim_part.field_2._M_allocated_capacity + 1);
            pPVar6 = local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pPVar8 = local_220.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        (local_208->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar11] = mVar10;
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)(((long)pPVar8 - (long)pPVar6 >> 4) * 0x4ec4ec4ec4ec4ec5));
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_250,(_Link_type)local_240._M_allocated_capacity);
    bVar3 = true;
LAB_005c5383:
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_220);
  }
  return bVar3;
}

Assistant:

bool BuildSkelTopology(
  const std::vector<value::token> &joints,
  std::vector<int> &dst,
  std::string *err) {

  if (joints.empty()) {
    return true;
  }

  std::vector<Path> paths(joints.size());
  for (size_t i = 0; i < joints.size(); i++) {
    Path p = Path(joints[i].str(), "");

    if (!p.is_valid()) {
      if (err) {
        (*err) += fmt::format("joints[{}] is invalid Prim path: `{}`", i, joints[i].str());
      }
      return false;
    }

    if (p.is_root_path()) {
      if (err) {
        (*err) += fmt::format("joints[{}] Root Prim path '/' cannot be used for joint Prim path.", i);
      }
      return false;
    }

    std::string _err;

    if (!pathutil::ValidatePrimPath(p, &_err)) {
      if (err) {
        (*err) += fmt::format("joints[{}] is not a valid Prim path: `{}`, reason = {}", i, joints[i].str(), _err);
      }
      return false;
    }
    
    paths[i] = p;
  }

  // path name <-> index map
  std::map<std::string, int> pathMap;
  for (size_t i = 0; i < paths.size(); i++) {
    pathMap[paths[i].prim_part()] = int(i); 
  }

  auto GetParentIndex = [](const std::map<std::string, int> &_pathMap, const Path &path) -> int {
    if (path.is_root_path()) {
      return -1;
    }
  
    // from pxrUSD's comment...
    //
    // Recurse over all ancestor paths, not just the direct parent.
    // For instance, if the map includes only paths 'a' and 'a/b/c',
    // 'a' will be treated as the parent of 'a/b/c'.
    //
    Path parentPath = path.get_parent_prim_path();
     
    uint32_t kMaxRec = 1024 * 128; // to avoid infinite loop.

    uint32_t depth = 0;
    while (parentPath.is_valid() && !parentPath.is_root_path()) {

      if (_pathMap.count(parentPath.prim_part())) {
        return _pathMap.at(parentPath.prim_part());
      } else {
      }

      parentPath = parentPath.get_parent_prim_path();
      depth++;

      if (depth >= kMaxRec) {
        // TODO: Report error
        return -1;
      } 
    }

    return -1;
  };

  dst.resize(joints.size());
  for (size_t i = 0; i < paths.size(); i++) {
    dst[i] = GetParentIndex(pathMap, paths[i]);
  }

  return true;
}